

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_charset_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
posix_charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (posix_charset_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  cpp_regex_traits<char> *this_00;
  reference pcVar4;
  ulong uVar5;
  long *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  byte *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eos((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (!bVar1) {
    uVar2 = (uint)(*in_RDI & 1);
    this_00 = &traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x166355)->super_cpp_regex_traits<char>;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(in_RSI);
    iVar3 = cpp_regex_traits<char>::isctype(this_00,(int)*pcVar4,(uint)*(ushort *)(in_RDI + 2));
    if (uVar2 != ((byte)iVar3 & 1)) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(in_RSI);
      uVar5 = (**(code **)(*in_RDX + 0x10))(in_RDX,in_RSI);
      if ((uVar5 & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator--(in_RSI);
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos() || this->not_ == traits_cast<Traits>(state).isctype(
                *state.cur_, this->mask_))
            {
                return false;
            }

            ++state.cur_;
            if(next.match(state))
            {
                return true;
            }

            --state.cur_;
            return false;
        }